

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O2

bool __thiscall mjs::gc_heap::gc_state::initial_state(gc_state *this)

{
  if (((this->level == 0) && (this->new_context == (allocation_context *)0x0)) &&
     ((this->pending_fixups).super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->pending_fixups).super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    return (this->weak_fixups).super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
           _M_impl.super__Vector_impl_data._M_start ==
           (this->weak_fixups).super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  }
  return false;
}

Assistant:

bool initial_state() const { return level == 0 && new_context == nullptr && pending_fixups.empty() && weak_fixups.empty(); }